

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_CORE_LL_HANDLE
IoTHubClientCore_LL_CreateFromConnectionString
          (char *connectionString,IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  bool bVar1;
  bool bVar2;
  _Bool use_dev_auth;
  int iVar3;
  IOTHUB_CLIENT_CONFIG *client_config;
  STRING_HANDLE handle;
  STRING_HANDLE output;
  STRING_HANDLE output_00;
  char *pcVar4;
  LOGGER_LOG p_Var5;
  STRING_TOKENIZER_HANDLE tokenizer;
  STRING_HANDLE handle_00;
  STRING_HANDLE handle_01;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *pIVar6;
  STRING_HANDLE local_88;
  STRING_HANDLE local_80;
  STRING_HANDLE local_70;
  STRING_HANDLE local_60;
  STRING_TOKENIZER_HANDLE local_58;
  STRING_HANDLE local_50;
  
  if (connectionString == (char *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar4 = "Input parameter is NULL: connectionString";
    iVar3 = 0x56c;
LAB_00121dac:
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar3,1,pcVar4);
    return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
  }
  if (protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar4 = "Input parameter is NULL: protocol";
    iVar3 = 0x571;
    goto LAB_00121dac;
  }
  client_config = (IOTHUB_CLIENT_CONFIG *)malloc(0x38);
  if (client_config == (IOTHUB_CLIENT_CONFIG *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar4 = "Malloc failed";
    iVar3 = 0x579;
    goto LAB_00121dac;
  }
  client_config->protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0;
  client_config->deviceId = (char *)0x0;
  client_config->iotHubName = (char *)0x0;
  client_config->iotHubSuffix = (char *)0x0;
  client_config->deviceKey = (char *)0x0;
  client_config->deviceSasToken = (char *)0x0;
  client_config->protocolGatewayHostName = (char *)0x0;
  client_config->protocol = protocol;
  handle = STRING_construct(connectionString);
  if (handle == (STRING_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar4 = "Error constructing connection String";
      iVar3 = 0x591;
LAB_00121e2a:
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar3,1,pcVar4);
    }
LAB_00121e40:
    local_60 = (STRING_HANDLE)0x0;
    output_00 = (STRING_HANDLE)0x0;
    output = (STRING_HANDLE)0x0;
    local_58 = (STRING_TOKENIZER_HANDLE)0x0;
  }
  else {
    local_58 = STRING_TOKENIZER_create(handle);
    if (local_58 == (STRING_TOKENIZER_HANDLE)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        pcVar4 = "Error creating Tokenizer";
        iVar3 = 0x596;
        goto LAB_00121e2a;
      }
      goto LAB_00121e40;
    }
    output = STRING_new();
    if (output == (STRING_HANDLE)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_CreateFromConnectionString",0x59b,1,
                  "Error creating Token String");
      }
      local_60 = (STRING_HANDLE)0x0;
      output_00 = (STRING_HANDLE)0x0;
      output = (STRING_HANDLE)0x0;
    }
    else {
      output_00 = STRING_new();
      if (output_00 == (STRING_HANDLE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5a0,1,
                    "Error creating Value String");
        }
        local_60 = (STRING_HANDLE)0x0;
        output_00 = (STRING_HANDLE)0x0;
      }
      else {
        local_60 = STRING_new();
        if (local_60 == (STRING_HANDLE)0x0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5a5,1,
                      "Error creating HostName String");
          }
          local_60 = (STRING_HANDLE)0x0;
        }
        else {
          local_70 = STRING_new();
          if (local_70 != (STRING_HANDLE)0x0) {
            use_dev_auth = false;
            bVar2 = false;
            local_88 = (STRING_HANDLE)0x0;
            local_80 = (STRING_HANDLE)0x0;
            handle_01 = (STRING_HANDLE)0x0;
            handle_00 = (STRING_HANDLE)0x0;
            local_50 = (STRING_HANDLE)0x0;
            while (iVar3 = STRING_TOKENIZER_get_next_token(local_58,output,"="), iVar3 == 0) {
              iVar3 = STRING_TOKENIZER_get_next_token(local_58,output_00,";");
              if (iVar3 != 0) {
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 != (LOGGER_LOG)0x0) {
                  (*p_Var5)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                            ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5b5,1,
                            "Tokenizer error");
                }
                break;
              }
              pcVar4 = STRING_c_str(output);
              iVar3 = strcmp(pcVar4,"HostName");
              if (iVar3 == 0) {
                tokenizer = STRING_TOKENIZER_create(output_00);
                if (tokenizer == (STRING_TOKENIZER_HANDLE)0x0) {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00121a67;
                  bVar1 = false;
                  iVar3 = 0x5c2;
                  pcVar4 = "Error creating Tokenizer";
                  goto LAB_00121b9e;
                }
                iVar3 = STRING_TOKENIZER_get_next_token(tokenizer,local_60,".");
                if (iVar3 == 0) {
                  pcVar4 = STRING_c_str(local_60);
                  client_config->iotHubName = pcVar4;
                  iVar3 = STRING_TOKENIZER_get_next_token(tokenizer,local_70,";");
                  if (iVar3 == 0) {
                    pcVar4 = STRING_c_str(local_70);
                    client_config->iotHubSuffix = pcVar4;
                    STRING_TOKENIZER_destroy(tokenizer);
                    goto LAB_00121c5e;
                  }
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    iVar3 = 0x5d2;
                    goto LAB_00121a4d;
                  }
                }
                else {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    iVar3 = 0x5c9;
LAB_00121a4d:
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                              ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar3,1,
                              "Tokenizer error");
                  }
                }
                STRING_TOKENIZER_destroy(tokenizer);
LAB_00121a67:
                bVar1 = false;
              }
              else {
                iVar3 = strcmp(pcVar4,"DeviceId");
                if (iVar3 == 0) {
                  local_50 = STRING_clone(output_00);
                  if (local_50 == (STRING_HANDLE)0x0) {
                    p_Var5 = xlogging_get_log_function();
                    if (p_Var5 != (LOGGER_LOG)0x0) {
                      (*p_Var5)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5e7,1,
                                "Failure cloning device id string");
                    }
                    bVar1 = false;
                    local_50 = (STRING_HANDLE)0x0;
                  }
                  else {
                    pcVar4 = STRING_c_str(local_50);
                    client_config->deviceId = pcVar4;
LAB_00121c5e:
                    bVar1 = true;
                  }
                }
                else {
                  iVar3 = strcmp(pcVar4,"SharedAccessKey");
                  if (iVar3 == 0) {
                    handle_00 = STRING_clone(output_00);
                    if (handle_00 != (STRING_HANDLE)0x0) {
                      pcVar4 = STRING_c_str(handle_00);
                      client_config->deviceKey = pcVar4;
                      goto LAB_00121c5e;
                    }
                    p_Var5 = xlogging_get_log_function();
                    if (p_Var5 != (LOGGER_LOG)0x0) {
                      (*p_Var5)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5f4,1,
                                "Failure cloning device key string");
                    }
                    bVar1 = false;
                    handle_00 = (STRING_HANDLE)0x0;
                  }
                  else {
                    iVar3 = strcmp(pcVar4,"SharedAccessSignature");
                    if (iVar3 == 0) {
                      handle_01 = STRING_clone(output_00);
                      if (handle_01 != (STRING_HANDLE)0x0) {
                        pcVar4 = STRING_c_str(handle_01);
                        client_config->deviceSasToken = pcVar4;
                        goto LAB_00121c5e;
                      }
                      p_Var5 = xlogging_get_log_function();
                      if (p_Var5 != (LOGGER_LOG)0x0) {
                        (*p_Var5)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                  ,"IoTHubClientCore_LL_CreateFromConnectionString",0x601,1,
                                  "Failure cloning device sasToken string");
                      }
                      bVar1 = false;
                      handle_01 = (STRING_HANDLE)0x0;
                    }
                    else {
                      iVar3 = strcmp(pcVar4,"x509");
                      if (iVar3 == 0) {
                        pcVar4 = STRING_c_str(output_00);
                        iVar3 = strcmp(pcVar4,"true");
                        if (iVar3 == 0) {
                          bVar2 = true;
                          goto LAB_00121c5e;
                        }
                        p_Var5 = xlogging_get_log_function();
                        if (p_Var5 != (LOGGER_LOG)0x0) {
                          bVar1 = false;
                          iVar3 = 0x609;
                          pcVar4 = 
                          "x509 option has wrong value, the only acceptable one is \"true\"";
                          goto LAB_00121b9e;
                        }
                        goto LAB_00121a67;
                      }
                      iVar3 = strcmp(pcVar4,"UseProvisioning");
                      if (iVar3 == 0) {
                        pcVar4 = STRING_c_str(output_00);
                        iVar3 = strcmp(pcVar4,"true");
                        if (iVar3 == 0) {
                          bVar1 = true;
                          use_dev_auth = true;
                        }
                        else {
                          p_Var5 = xlogging_get_log_function();
                          if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00121a67;
                          bVar1 = false;
                          iVar3 = 0x615;
                          pcVar4 = 
                          "provisioning option has wrong value, the only acceptable one is \"true\""
                          ;
LAB_00121b9e:
                          (*p_Var5)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                    ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar3,1,pcVar4
                                   );
                        }
                      }
                      else {
                        iVar3 = strcmp(pcVar4,"GatewayHostName");
                        if (iVar3 == 0) {
                          local_80 = STRING_clone(output_00);
                          if (local_80 != (STRING_HANDLE)0x0) {
                            pcVar4 = STRING_c_str(local_80);
                            client_config->protocolGatewayHostName = pcVar4;
                            goto LAB_00121c5e;
                          }
                          p_Var5 = xlogging_get_log_function();
                          if (p_Var5 != (LOGGER_LOG)0x0) {
                            (*p_Var5)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                      ,"IoTHubClientCore_LL_CreateFromConnectionString",0x627,1,
                                      "Failure cloning protocol Gateway Name");
                          }
                          bVar1 = false;
                          local_80 = (STRING_HANDLE)0x0;
                        }
                        else {
                          iVar3 = strcmp(pcVar4,"ModuleId");
                          if (iVar3 == 0) {
                            local_88 = STRING_clone(output_00);
                            if (local_88 != (STRING_HANDLE)0x0) goto LAB_00121c5e;
                            p_Var5 = xlogging_get_log_function();
                            if (p_Var5 != (LOGGER_LOG)0x0) {
                              (*p_Var5)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                                        ,"IoTHubClientCore_LL_CreateFromConnectionString",0x630,1,
                                        "Failure cloning moduleId string");
                            }
                            bVar1 = false;
                            local_88 = (STRING_HANDLE)0x0;
                          }
                          else {
                            p_Var5 = xlogging_get_log_function();
                            bVar1 = true;
                            if (p_Var5 != (LOGGER_LOG)0x0) {
                              iVar3 = 0x637;
                              pcVar4 = 
                              "Unknown token <%s> in connection string.  Ignoring error and continuing to parse"
                              ;
                              bVar1 = true;
                              goto LAB_00121b9e;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              if (!bVar1) break;
            }
            if (client_config->iotHubName == (char *)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) {
LAB_00122303:
                pIVar6 = (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
                goto LAB_00121e73;
              }
              pcVar4 = "iotHubName is not found";
              iVar3 = 0x63f;
            }
            else if (client_config->iotHubSuffix == (char *)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00122303;
              pcVar4 = "iotHubSuffix is not found";
              iVar3 = 0x644;
            }
            else if (client_config->deviceId == (char *)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00122303;
              pcVar4 = "deviceId is not found";
              iVar3 = 0x649;
            }
            else {
              if (bVar2 || use_dev_auth) {
                if ((client_config->deviceSasToken == (char *)0x0) &&
                   (client_config->deviceKey == (char *)0x0)) {
LAB_001222a7:
                  pcVar4 = STRING_c_str(local_88);
                  pIVar6 = initialize_iothub_client
                                     (client_config,(IOTHUB_CLIENT_DEVICE_CONFIG *)0x0,use_dev_auth,
                                      pcVar4);
                  if (pIVar6 != (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) goto LAB_00121e73;
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00122303;
                  pcVar4 = "IoTHubClientCore_LL_Create failed";
                  iVar3 = 0x659;
                  goto LAB_0012227f;
                }
              }
              else if ((client_config->deviceKey == (char *)0x0) !=
                       (client_config->deviceSasToken == (char *)0x0)) goto LAB_001222a7;
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00122303;
              pcVar4 = "invalid combination of x509, provisioning, deviceSasToken and deviceKey";
              iVar3 = 0x651;
            }
LAB_0012227f:
            pIVar6 = (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_CreateFromConnectionString",iVar3,1,pcVar4);
            goto LAB_00121e73;
          }
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_CreateFromConnectionString",0x5aa,1,
                      "Error creating HostSuffix String");
          }
        }
      }
    }
  }
  local_88 = (STRING_HANDLE)0x0;
  local_70 = (STRING_HANDLE)0x0;
  local_80 = (STRING_HANDLE)0x0;
  local_50 = (STRING_HANDLE)0x0;
  handle_01 = (STRING_HANDLE)0x0;
  handle_00 = (STRING_HANDLE)0x0;
  pIVar6 = (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
LAB_00121e73:
  if (handle_01 != (STRING_HANDLE)0x0) {
    STRING_delete(handle_01);
  }
  if (handle_00 != (STRING_HANDLE)0x0) {
    STRING_delete(handle_00);
  }
  if (local_50 != (STRING_HANDLE)0x0) {
    STRING_delete(local_50);
  }
  if (local_70 != (STRING_HANDLE)0x0) {
    STRING_delete(local_70);
  }
  if (local_60 != (STRING_HANDLE)0x0) {
    STRING_delete(local_60);
  }
  if (output_00 != (STRING_HANDLE)0x0) {
    STRING_delete(output_00);
  }
  if (output != (STRING_HANDLE)0x0) {
    STRING_delete(output);
  }
  if (handle != (STRING_HANDLE)0x0) {
    STRING_delete(handle);
  }
  if (local_80 != (STRING_HANDLE)0x0) {
    STRING_delete(local_80);
  }
  if (local_88 != (STRING_HANDLE)0x0) {
    STRING_delete(local_88);
  }
  if (local_58 != (STRING_TOKENIZER_HANDLE)0x0) {
    STRING_TOKENIZER_destroy(local_58);
  }
  free(client_config);
  return pIVar6;
}

Assistant:

IOTHUB_CLIENT_CORE_LL_HANDLE IoTHubClientCore_LL_CreateFromConnectionString(const char* connectionString, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE result;

    if (connectionString == NULL)
    {
        LogError("Input parameter is NULL: connectionString");
        result = NULL;
    }
    else if (protocol == NULL)
    {
        LogError("Input parameter is NULL: protocol");
        result = NULL;
    }
    else
    {
        IOTHUB_CLIENT_CONFIG* config = (IOTHUB_CLIENT_CONFIG*) malloc(sizeof(IOTHUB_CLIENT_CONFIG));
        if (config == NULL)
        {
            LogError("Malloc failed");
            result = NULL;
        }
        else
        {
            STRING_TOKENIZER_HANDLE tokenizer1 = NULL;
            STRING_HANDLE connString = NULL;
            STRING_HANDLE tokenString = NULL;
            STRING_HANDLE valueString = NULL;
            STRING_HANDLE hostNameString = NULL;
            STRING_HANDLE hostSuffixString = NULL;
            STRING_HANDLE deviceIdString = NULL;
            STRING_HANDLE deviceKeyString = NULL;
            STRING_HANDLE deviceSasTokenString = NULL;
            STRING_HANDLE protocolGateway = NULL;
            STRING_HANDLE moduleId = NULL;

            memset(config, 0, sizeof(*config));
            config->protocol = protocol;

            config->protocolGatewayHostName = NULL;

            if ((connString = STRING_construct(connectionString)) == NULL)
            {
                LogError("Error constructing connection String");
                result = NULL;
            }
            else if ((tokenizer1 = STRING_TOKENIZER_create(connString)) == NULL)
            {
                LogError("Error creating Tokenizer");
                result = NULL;
            }
            else if ((tokenString = STRING_new()) == NULL)
            {
                LogError("Error creating Token String");
                result = NULL;
            }
            else if ((valueString = STRING_new()) == NULL)
            {
                LogError("Error creating Value String");
                result = NULL;
            }
            else if ((hostNameString = STRING_new()) == NULL)
            {
                LogError("Error creating HostName String");
                result = NULL;
            }
            else if ((hostSuffixString = STRING_new()) == NULL)
            {
                LogError("Error creating HostSuffix String");
                result = NULL;
            }
            else
            {
                int isx509found = 0;
                bool use_provisioning = false;
                while ((STRING_TOKENIZER_get_next_token(tokenizer1, tokenString, "=") == 0))
                {
                    if (STRING_TOKENIZER_get_next_token(tokenizer1, valueString, ";") != 0)
                    {
                        LogError("Tokenizer error");
                        break;
                    }
                    else
                    {
                        if (tokenString != NULL)
                        {
                            const char* s_token = STRING_c_str(tokenString);
                            if (strcmp(s_token, HOSTNAME_TOKEN) == 0)
                            {
                                STRING_TOKENIZER_HANDLE tokenizer2 = NULL;
                                if ((tokenizer2 = STRING_TOKENIZER_create(valueString)) == NULL)
                                {
                                    LogError("Error creating Tokenizer");
                                    break;
                                }
                                else
                                {
                                    if (STRING_TOKENIZER_get_next_token(tokenizer2, hostNameString, ".") != 0)
                                    {
                                        LogError("Tokenizer error");
                                        STRING_TOKENIZER_destroy(tokenizer2);
                                        break;
                                    }
                                    else
                                    {
                                        config->iotHubName = STRING_c_str(hostNameString);
                                        if (STRING_TOKENIZER_get_next_token(tokenizer2, hostSuffixString, ";") != 0)
                                        {
                                            LogError("Tokenizer error");
                                            STRING_TOKENIZER_destroy(tokenizer2);
                                            break;
                                        }
                                        else
                                        {
                                            config->iotHubSuffix = STRING_c_str(hostSuffixString);
                                        }
                                    }
                                    STRING_TOKENIZER_destroy(tokenizer2);
                                }
                            }
                            else if (strcmp(s_token, DEVICEID_TOKEN) == 0)
                            {
                                deviceIdString = STRING_clone(valueString);
                                if (deviceIdString != NULL)
                                {
                                    config->deviceId = STRING_c_str(deviceIdString);
                                }
                                else
                                {
                                    LogError("Failure cloning device id string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, DEVICEKEY_TOKEN) == 0)
                            {
                                deviceKeyString = STRING_clone(valueString);
                                if (deviceKeyString != NULL)
                                {
                                    config->deviceKey = STRING_c_str(deviceKeyString);
                                }
                                else
                                {
                                    LogError("Failure cloning device key string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, DEVICESAS_TOKEN) == 0)
                            {
                                deviceSasTokenString = STRING_clone(valueString);
                                if (deviceSasTokenString != NULL)
                                {
                                    config->deviceSasToken = STRING_c_str(deviceSasTokenString);
                                }
                                else
                                {
                                    LogError("Failure cloning device sasToken string");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, X509_TOKEN) == 0)
                            {
                                if (strcmp(STRING_c_str(valueString), X509_TOKEN_ONLY_ACCEPTABLE_VALUE) != 0)
                                {
                                    LogError("x509 option has wrong value, the only acceptable one is \"true\"");
                                    break;
                                }
                                else
                                {
                                    isx509found = 1;
                                }
                            }
                            else if (strcmp(s_token, PROVISIONING_TOKEN) == 0)
                            {
                                if (strcmp(STRING_c_str(valueString), PROVISIONING_ACCEPTABLE_VALUE) != 0)
                                {
                                    LogError("provisioning option has wrong value, the only acceptable one is \"true\"");
                                    break;
                                }
                                else
                                {
                                    use_provisioning = 1;
                                }
                            }

                            else if (strcmp(s_token, PROTOCOL_GATEWAY_HOST_TOKEN) == 0)
                            {
                                protocolGateway = STRING_clone(valueString);
                                if (protocolGateway != NULL)
                                {
                                    config->protocolGatewayHostName = STRING_c_str(protocolGateway);
                                }
                                else
                                {
                                    LogError("Failure cloning protocol Gateway Name");
                                    break;
                                }
                            }
                            else if (strcmp(s_token, MODULE_ID_TOKEN) == 0)
                            {
                                moduleId = STRING_clone(valueString);
                                if (moduleId == NULL)
                                {
                                    LogError("Failure cloning moduleId string");
                                    break;
                                }
                            }
                            else
                            {
                                // If we get an unknown token, log it to error stream but do not cause a fatal error.
                                LogError("Unknown token <%s> in connection string.  Ignoring error and continuing to parse", s_token);
                            }
                        }
                    }
                }
                /* parsing is done - check the result */
                if (config->iotHubName == NULL)
                {
                    LogError("iotHubName is not found");
                    result = NULL;
                }
                else if (config->iotHubSuffix == NULL)
                {
                    LogError("iotHubSuffix is not found");
                    result = NULL;
                }
                else if (config->deviceId == NULL)
                {
                    LogError("deviceId is not found");
                    result = NULL;
                }
                else if (!(
                    ((!use_provisioning && !isx509found) && (config->deviceSasToken == NULL) ^ (config->deviceKey == NULL)) ||
                    ((use_provisioning || isx509found) && (config->deviceSasToken == NULL) && (config->deviceKey == NULL))
                    ))
                {
                    LogError("invalid combination of x509, provisioning, deviceSasToken and deviceKey");
                    result = NULL;
                }
                else
                {
                    result = initialize_iothub_client(config, NULL, use_provisioning, STRING_c_str(moduleId));
                    if (result == NULL)
                    {
                        LogError("IoTHubClientCore_LL_Create failed");
                    }
                    else
                    {
                        /*return as is*/
                    }
                }
            }
            if (deviceSasTokenString != NULL)
                STRING_delete(deviceSasTokenString);
            if (deviceKeyString != NULL)
                STRING_delete(deviceKeyString);
            if (deviceIdString != NULL)
                STRING_delete(deviceIdString);
            if (hostSuffixString != NULL)
                STRING_delete(hostSuffixString);
            if (hostNameString != NULL)
                STRING_delete(hostNameString);
            if (valueString != NULL)
                STRING_delete(valueString);
            if (tokenString != NULL)
                STRING_delete(tokenString);
            if (connString != NULL)
                STRING_delete(connString);
            if (protocolGateway != NULL)
                STRING_delete(protocolGateway);
            if (moduleId != NULL)
                STRING_delete(moduleId);

            if (tokenizer1 != NULL)
                STRING_TOKENIZER_destroy(tokenizer1);

            free(config);
        }
    }
    return result;
}